

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O1

void __thiscall clunk::Move::Init(Move *this,uint32_t bits,int score)

{
  bool bVar1;
  uint uVar2;
  
  this->bits = bits;
  this->score = score;
  uVar2 = -score;
  if (0 < score) {
    uVar2 = score;
  }
  if (uVar2 < 0x7d01) {
    if (bits != 0) {
      bVar1 = IsValid(this);
      if (!bVar1) {
        __assert_fail("!bits || IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Move.h"
                      ,0x48,"void clunk::Move::Init(const uint32_t, const int)");
      }
    }
    return;
  }
  __assert_fail("abs(score) <= Infinity",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Move.h",
                0x47,"void clunk::Move::Init(const uint32_t, const int)");
}

Assistant:

void Init(const uint32_t bits, const int score) {
    this->bits = bits;
    this->score = static_cast<int32_t>(score);
    assert(abs(score) <= Infinity);
    assert(!bits || IsValid());
  }